

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

void __thiscall ON_DimStyle::SetDimTextLocation(ON_DimStyle *this,TextLocation a)

{
  TextLocation a_local;
  ON_DimStyle *this_local;
  
  if (this->m_dim_text_location != a) {
    this->m_dim_text_location = a;
    Internal_TextPositionPropertiesChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,DimTextLocation);
  return;
}

Assistant:

void ON_DimStyle::SetDimTextLocation(ON_DimStyle::TextLocation a)
{
  if (m_dim_text_location != a)
  {
    m_dim_text_location = a;
    Internal_TextPositionPropertiesChange();
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(ON_DimStyle::field::DimTextLocation);
}